

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

charcount_t __thiscall
Js::LineOffsetCache::GetCharacterOffsetForLine
          (LineOffsetCache *this,charcount_t line,charcount_t *outByteOffset)

{
  charcount_t cVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar6;
  uint *puVar7;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **ppRVar8;
  charcount_t local_38;
  charcount_t characterOffset;
  charcount_t *outByteOffset_local;
  charcount_t line_local;
  LineOffsetCache *this_local;
  
  uVar4 = GetLineCount(this);
  if (uVar4 <= line) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x6d,"(line < this->GetLineCount())",
                                "Invalid line value passed in.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = Memory::
           WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
           operator->(&this->lineCharacterOffsetCacheList);
  puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item(pRVar6,line);
  cVar1 = *puVar7;
  if (outByteOffset != (charcount_t *)0x0) {
    ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__
                        ((WriteBarrierPtr *)&this->lineByteOffsetCacheList);
    local_38 = cVar1;
    if (*ppRVar8 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      pRVar6 = Memory::
               WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
               ::operator->(&this->lineByteOffsetCacheList);
      puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                         (pRVar6,line);
      local_38 = *puVar7;
    }
    *outByteOffset = local_38;
  }
  return cVar1;
}

Assistant:

charcount_t LineOffsetCache::GetCharacterOffsetForLine(charcount_t line, charcount_t *outByteOffset) const
    {
        AssertMsg(line < this->GetLineCount(), "Invalid line value passed in.");

        charcount_t characterOffset = this->lineCharacterOffsetCacheList->Item(line);

        if (outByteOffset != nullptr)
        {            
            *outByteOffset = this->lineByteOffsetCacheList? this->lineByteOffsetCacheList->Item(line) : characterOffset;            
        }

        return characterOffset;
    }